

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMatrixSlice.h
# Opt level: O3

void __thiscall
HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::iterator
          (iterator *this,HighsInt *nodeIndex,double *nodeValue,HighsInt *nodeLeft,
          HighsInt *nodeRight,HighsInt node)

{
  iterator __position;
  int local_14;
  
  (this->pos_).index_ = nodeIndex + node;
  (this->pos_).value_ = nodeValue + node;
  this->nodeLeft = nodeLeft;
  this->nodeRight = nodeRight;
  (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->currentNode = node;
  std::vector<int,_std::allocator<int>_>::reserve(&this->stack,0x10);
  __position._M_current =
       (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if (__position._M_current ==
      (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&this->stack,__position,&local_14);
  }
  else {
    *__position._M_current = -1;
    (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

iterator(const HighsInt* nodeIndex, const double* nodeValue,
             const HighsInt* nodeLeft, const HighsInt* nodeRight, HighsInt node)
        : pos_(nodeIndex + node, nodeValue + node),
          nodeLeft(nodeLeft),
          nodeRight(nodeRight),
          currentNode(node) {
      stack.reserve(16);
      stack.push_back(-1);
    }